

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EntryToLocaleString(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptArray *arr;
  JavascriptString *pJVar7;
  char16_t *varName;
  int32 hCode;
  int in_stack_00000010;
  CallInfo local_60;
  CallInfo callInfo_local;
  ArgumentReader args;
  JsReentLock jsReentLock;
  RecyclableObject *obj;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1ea6,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b7b658;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_60);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)pSVar1->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)args.super_Arguments.Values)->noJsReentrancy;
  ((ThreadContext *)args.super_Arguments.Values)->noJsReentrancy = true;
  pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  JsReentLock::setObjectForMutation((JsReentLock *)&args.super_Arguments.Values,pvVar6);
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1eab,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00b7b658:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    bVar3 = IsDirectAccessArray(pvVar6);
    if (bVar3) {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      arr = UnsafeVarTo<Js::JavascriptArray>(pvVar6);
      *(undefined1 *)(args.super_Arguments.Values + 0x21) = jsReentLock.m_arrayObject2._0_1_;
      pJVar7 = ToLocaleString<Js::JavascriptArray>(arr,pSVar1);
    }
    else {
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      BVar4 = TypedArrayBase::IsDetachedTypedArray(pvVar6);
      if (BVar4 != 0) {
        varName = L"Array.prototype.toLocalString";
        hCode = -0x7ff5ebe5;
        goto LAB_00b7b674;
      }
      jsReentLock.m_savedNoJsReentrancy = false;
      jsReentLock._25_7_ = 0;
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      BVar4 = JavascriptConversion::ToObject
                        (pvVar6,pSVar1,(RecyclableObject **)&jsReentLock.m_savedNoJsReentrancy);
      if (BVar4 == 0) {
        JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Array.prototype.toLocaleString");
      }
      *(undefined1 *)(args.super_Arguments.Values + 0x21) = jsReentLock.m_arrayObject2._0_1_;
      pJVar7 = ToLocaleString<Js::RecyclableObject>((RecyclableObject *)jsReentLock._24_8_,pSVar1);
    }
    *(undefined1 *)(args.super_Arguments.Values + 0x21) = jsReentLock.m_arrayObject2._0_1_;
    return pJVar7;
  }
  varName = L"Array.prototype.toLocaleString";
  hCode = -0x7ff5ec41;
LAB_00b7b674:
  JavascriptError::ThrowTypeError(pSVar1,hCode,varName);
}

Assistant:

Var JavascriptArray::EntryToLocaleString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Array.prototype.toLocaleString"));
        }

        if (JavascriptArray::IsDirectAccessArray(args[0]))
        {
            JavascriptArray* arr = UnsafeVarTo<JavascriptArray>(args[0]);
            JS_REENTRANT_UNLOCK(jsReentLock, return ToLocaleString(arr, scriptContext));
        }
        else
        {
            if (TypedArrayBase::IsDetachedTypedArray(args[0]))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("Array.prototype.toLocalString"));
            }

            RecyclableObject* obj = nullptr;
            if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &obj))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.toLocaleString"));
            }
            JS_REENTRANT_UNLOCK(jsReentLock, return ToLocaleString(obj, scriptContext));
        }
    }